

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O3

string_view slang::ast::OpInfo::getText(BinaryOperator op)

{
  string_view sVar1;
  
  sVar1._M_str = &DAT_004ee34c + *(int *)(&DAT_004ee34c + (long)(int)op * 4);
  sVar1._M_len = *(size_t *)(&DAT_004ee3c0 + (long)(int)op * 8);
  return sVar1;
}

Assistant:

std::string_view OpInfo::getText(BinaryOperator op) {
    switch (op) {
        case BinaryOperator::Add:
            return "+";
        case BinaryOperator::Subtract:
            return "-";
        case BinaryOperator::Multiply:
            return "*";
        case BinaryOperator::Divide:
            return "/";
        case BinaryOperator::Mod:
            return "%";
        case BinaryOperator::BinaryAnd:
            return "&";
        case BinaryOperator::BinaryOr:
            return "|";
        case BinaryOperator::BinaryXor:
            return "^";
        case BinaryOperator::BinaryXnor:
            return "~^";
        case BinaryOperator::Equality:
            return "==";
        case BinaryOperator::Inequality:
            return "!=";
        case BinaryOperator::CaseEquality:
            return "===";
        case BinaryOperator::CaseInequality:
            return "!==";
        case BinaryOperator::GreaterThanEqual:
            return ">=";
        case BinaryOperator::GreaterThan:
            return ">";
        case BinaryOperator::LessThanEqual:
            return "<=";
        case BinaryOperator::LessThan:
            return "<";
        case BinaryOperator::WildcardEquality:
            return "==?";
        case BinaryOperator::WildcardInequality:
            return "!=?";
        case BinaryOperator::LogicalAnd:
            return "&&";
        case BinaryOperator::LogicalOr:
            return "||";
        case BinaryOperator::LogicalImplication:
            return "->";
        case BinaryOperator::LogicalEquivalence:
            return "<->";
        case BinaryOperator::LogicalShiftLeft:
            return "<<";
        case BinaryOperator::LogicalShiftRight:
            return ">>";
        case BinaryOperator::ArithmeticShiftLeft:
            return "<<<";
        case BinaryOperator::ArithmeticShiftRight:
            return ">>>";
        case BinaryOperator::Power:
            return "**";
    }
    SLANG_UNREACHABLE;
}